

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O0

uint32_t FastPForLib::Simple9_Codec::Decompress
                   (uint32_t *input,uint32_t inOffset,uint32_t *output,uint32_t outOffset,
                   uint32_t outCount)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  byte bVar4;
  uint local_5c;
  uint32_t *out_1;
  uint32_t *out;
  uint32_t i;
  uint32_t bitMask;
  uint32_t bitLen;
  uint32_t intNum;
  uint32_t code;
  uint32_t val;
  uint32_t remainingCount;
  uint32_t outEnd;
  uint32_t outPos;
  uint32_t inPos;
  uint32_t outCount_local;
  uint32_t outOffset_local;
  uint32_t *output_local;
  uint32_t inOffset_local;
  uint32_t *input_local;
  
  inPos = inOffset;
  for (outPos = outOffset; outPos < outOffset + outCount; outPos = local_5c + outPos) {
    local_5c = (outOffset + outCount) - outPos;
    val = input[inPos];
    bVar4 = (byte)*(undefined4 *)(Simple9_Codec_bitLength + (ulong)(val >> 0x1c) * 4);
    uVar1 = (1 << (bVar4 & 0x1f)) - 1;
    if (*(uint *)(Simple9_Codec_intNumber + (ulong)(val >> 0x1c) * 4) < local_5c) {
      local_5c = *(uint *)(Simple9_Codec_intNumber + (ulong)(val >> 0x1c) * 4);
    }
    for (i = 0; i < local_5c; i = i + 7) {
      puVar3 = output + (ulong)outPos + (ulong)i;
      *puVar3 = val & uVar1;
      uVar2 = val >> (bVar4 & 0x1f);
      puVar3[1] = uVar2 & uVar1;
      uVar2 = uVar2 >> (bVar4 & 0x1f);
      puVar3[2] = uVar2 & uVar1;
      uVar2 = uVar2 >> (bVar4 & 0x1f);
      puVar3[3] = uVar2 & uVar1;
      uVar2 = uVar2 >> (bVar4 & 0x1f);
      puVar3[4] = uVar2 & uVar1;
      uVar2 = uVar2 >> (bVar4 & 0x1f);
      puVar3[5] = uVar2 & uVar1;
      uVar2 = uVar2 >> (bVar4 & 0x1f);
      puVar3[6] = uVar2 & uVar1;
      val = uVar2 >> (bVar4 & 0x1f);
    }
    for (; i < local_5c; i = i + 1) {
      output[(ulong)outPos + (ulong)i] = val & uVar1;
      val = val >> (bVar4 & 0x1f);
    }
    inPos = inPos + 1;
  }
  return inPos;
}

Assistant:

static uint32_t Decompress(const uint32_t *input, uint32_t inOffset,
                             uint32_t *output, uint32_t outOffset,
                             uint32_t outCount) {
    uint32_t inPos = inOffset;
    uint32_t outPos = outOffset;
    uint32_t outEnd = outOffset + outCount;

    while (outPos < outEnd) {
      uint32_t remainingCount = outEnd - outPos;

      uint32_t val = input[inPos++];
      uint32_t code = val >> SIMPLE9_BITSIZE;

#if defined(_SIMPLE9_USE_RLE)
      if (code == RLE_SELECTOR_VALUE) {
        // decode rle-encoded integers
        uint32_t repeatValue = val & RLE_MAX_VALUE_MASK;
        uint32_t repeatCount = (val >> RLE_MAX_VALUE_BITS) & RLE_MAX_COUNT_MASK;
        repeatCount =
            (repeatCount < remainingCount) ? repeatCount : remainingCount;

        for (uint32_t i = 0; i < repeatCount; ++i) {
          output[outPos++] = repeatValue;
        }
      }
#else
      // optional check for end-of-stream
      if (SIMPLE9_MINCODE == 1 && code == 0) {
        break; // end of stream
      }
#endif
      else {
        // decode bit-packed integers
        uint32_t intNum = Simple9_Codec_intNumber[code];
        uint32_t bitLen = Simple9_Codec_bitLength[code];
        uint32_t bitMask = (1U << bitLen) - 1;
        intNum = (intNum < remainingCount)
                     ? intNum
                     : remainingCount; // optional buffer end check

#if defined(_DONT_UNROLL_LOOP)
        for (uint32_t i = 0; i < intNum; ++i) {
          output[outPos++] = val & bitMask;
          val >>= bitLen;
        }
#else
        uint32_t i = 0;
        for (; i < intNum; i += 7) {
          auto out = output + outPos + i;
          out[0] = val & bitMask;
          val >>= bitLen;
          out[1] = val & bitMask;
          val >>= bitLen;
          out[2] = val & bitMask;
          val >>= bitLen;
          out[3] = val & bitMask;
          val >>= bitLen;
          out[4] = val & bitMask;
          val >>= bitLen;
          out[5] = val & bitMask;
          val >>= bitLen;
          out[6] = val & bitMask;
          val >>= bitLen;
        }
        for (; i < intNum; ++i) {
          auto out = output + outPos + i;
          out[0] = val & bitMask;
          val >>= bitLen;
        }
        outPos += intNum;
#endif
      }
    }